

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

void bssl::dtls1_next_message(SSL *ssl)

{
  bool bVar1;
  size_t index;
  SSL *ssl_local;
  
  if ((*(ushort *)&ssl->s3->field_0xdc >> 3 & 1) == 0) {
    __assert_fail("ssl->s3->has_message",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                  ,0x1c4,"void bssl::dtls1_next_message(SSL *)");
  }
  bVar1 = dtls1_is_current_message_complete(ssl);
  if (!bVar1) {
    __assert_fail("dtls1_is_current_message_complete(ssl)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                  ,0x1c5,"void bssl::dtls1_next_message(SSL *)");
  }
  std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::reset
            (ssl->d1->incoming_messages + (int)((uint)ssl->d1->handshake_read_seq % 7),(pointer)0x0)
  ;
  ssl->d1->handshake_read_seq = ssl->d1->handshake_read_seq + 1;
  if (ssl->d1->handshake_read_seq == 0) {
    *(ushort *)ssl->d1 = *(ushort *)ssl->d1 & 0xffef | 0x10;
  }
  *(ushort *)&ssl->s3->field_0xdc = *(ushort *)&ssl->s3->field_0xdc & 0xfff7;
  if ((*(ushort *)ssl->d1 >> 1 & 1) != 0) {
    *(ushort *)ssl->d1 = *(ushort *)ssl->d1 & 0xfffb | 4;
  }
  return;
}

Assistant:

void dtls1_next_message(SSL *ssl) {
  assert(ssl->s3->has_message);
  assert(dtls1_is_current_message_complete(ssl));
  size_t index = ssl->d1->handshake_read_seq % SSL_MAX_HANDSHAKE_FLIGHT;
  ssl->d1->incoming_messages[index].reset();
  ssl->d1->handshake_read_seq++;
  if (ssl->d1->handshake_read_seq == 0) {
    ssl->d1->handshake_read_overflow = true;
  }
  ssl->s3->has_message = false;
  // If we previously sent a flight, mark it as having a reply, so
  // |on_handshake_complete| can manage post-handshake retransmission.
  if (ssl->d1->outgoing_messages_complete) {
    ssl->d1->flight_has_reply = true;
  }
}